

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

bool getIntArguments<4>(char **lp,aint (*args) [4],bool (*argOptional) [4])

{
  bool bVar1;
  int iVar2;
  long lVar3;
  aint val;
  aint local_2c;
  
  lVar3 = 0;
  do {
    if ((lVar3 != 0) && (bVar1 = comma(lp), !bVar1)) {
      return (*argOptional)[lVar3];
    }
    iVar2 = ParseExpression(lp,&local_2c);
    if (iVar2 == 0) {
      return (bool)(lVar3 == 0 & (*argOptional)[0]);
    }
    (*args)[lVar3] = local_2c;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  bVar1 = comma(lp);
  return !bVar1;
}

Assistant:

bool getIntArguments(char*& lp, aint (&args)[argsN], const bool (&argOptional)[argsN]) {
	for (int i = 0; i < argsN; ++i) {
		if (0 < i && !comma(lp)) return argOptional[i];
		aint val;				// temporary variable to preserve original value in case of error
		if (!ParseExpression(lp, val)) return (0 == i) && argOptional[i];
		args[i] = val;
	}
	return !comma(lp);
}